

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::VerifyConnect(TPZCheckMesh *this,int connect)

{
  TPZCompEl *pTVar1;
  int iVar2;
  TPZConnect *pTVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_ac;
  TPZCompElSide large;
  TPZStack<int,_10> deplist;
  TPZCompElSide large_1;
  
  FindElement((TPZCheckMesh *)&deplist,(int)this);
  pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,(long)connect
                     );
  local_ac = 1;
  TPZCompElSide::LowerLevelElementList(&large,(int)(TPZCheckMesh *)&deplist);
  if ((pTVar3->fDependList != (TPZDepend *)0x0) && (large.fEl == (TPZCompEl *)0x0)) {
    poVar4 = std::operator<<(this->fOut,"Connect ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
    std::operator<<(poVar4," has dependency but no large element\n");
    local_ac = 0;
  }
  if (((pTVar3->fNShape != 0) && (pTVar3->fDependList == (TPZDepend *)0x0)) &&
     (large.fEl != (TPZCompEl *)0x0)) {
    poVar4 = std::operator<<(this->fOut,"Connect ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
    std::operator<<(poVar4," has no dependency but has large element\n");
    local_ac = 0;
  }
  TPZStack<int,_10>::TPZStack(&deplist);
  BuildDependList(this,connect,&deplist);
  uVar7 = 0;
  uVar5 = (ulong)(uint)deplist.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
  if ((int)(uint)deplist.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar7 == uVar5) {
      TPZManVector<int,_10>::~TPZManVector(&deplist.super_TPZManVector<int,_10>);
      return local_ac;
    }
    FindElement((TPZCheckMesh *)&large,(int)this);
    TPZCompElSide::LowerLevelElementList(&large_1,(int)(TPZCheckMesh *)&large);
    pTVar1 = large_1.fEl;
    if (large_1.fEl == (TPZCompEl *)0x0) {
      poVar4 = std::operator<<(this->fOut,"VerifyConnect of connect ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(this->fOut,"deplist = ");
      poVar4 = ::operator<<(poVar4,(TPZVec<int> *)&deplist);
      poVar4 = std::operator<<(poVar4," deplist[id] = ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,deplist.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[uVar7]
                         );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(this->fOut,
                               "Connect index of connect which is restrained deplist[id] = ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,deplist.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[uVar7]
                         );
      std::endl<char,std::char_traits<char>>(poVar4);
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          (long)deplist.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[uVar7])
      ;
      TPZConnect::Print(pTVar3,this->fMesh,this->fOut);
      poVar4 = std::operator<<(this->fOut,"Element/side which contains deplist[id] side = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,large.fSide);
      std::operator<<(poVar4,"\n");
      (**(code **)(*(long *)large.fEl + 200))(large.fEl,this->fOut);
      poVar4 = std::operator<<(this->fOut,"VerifyConnect of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
      std::operator<<(poVar4," inconsistent\n");
LAB_00ff788e:
      local_ac = 0;
    }
    else {
      iVar2 = (**(code **)(*(long *)large_1.fEl + 0x90))(large_1.fEl);
      iVar8 = 0;
      iVar9 = 0;
      if (0 < iVar2) {
        iVar9 = iVar2;
      }
      while ((iVar10 = iVar9, iVar9 != iVar8 &&
             (lVar6 = (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,iVar8), iVar10 = iVar8,
             lVar6 != connect))) {
        iVar8 = iVar8 + 1;
      }
      if (iVar10 == iVar2) {
        poVar4 = std::operator<<(this->fOut,"VerifyConnect of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,connect);
        std::operator<<(poVar4," inconsistent\n");
        goto LAB_00ff788e;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int TPZCheckMesh::VerifyConnect(int connect) {

    int check = 1;

    {
        TPZCompElSide elcon = FindElement(connect);
        TPZConnect &c = fMesh->ConnectVec()[connect];
        TPZCompElSide large = elcon.LowerLevelElementList(1);
        if (c.HasDependency() && !large) {
            *fOut << "Connect " << connect << " has dependency but no large element\n";
            check = 0;
        }
        if(c.NShape() && !c.HasDependency() && large)
        {
            *fOut << "Connect " << connect << " has no dependency but has large element\n";
            check = 0;
        }
    }
	TPZStack<int> deplist;
	BuildDependList(connect,deplist);
	int ndep = deplist.NElements();
	int id;
	for(id=0; id<ndep; id++) {
		TPZCompElSide smalll = FindElement(deplist[id]);
		TPZCompElSide large = smalll.LowerLevelElementList(1);
		if(!large.Exists()) {
			check = 0;
            (*fOut) << "VerifyConnect of connect " << connect << std::endl;
            (*fOut) << "deplist = " << deplist << " deplist[id] = " << deplist[id] << std::endl;
            (*fOut) << "Connect index of connect which is restrained deplist[id] = " << deplist[id] << std::endl;
            TPZConnect &c = fMesh->ConnectVec()[deplist[id]];
            c.Print(*fMesh,(*fOut));
            (*fOut) << "Element/side which contains deplist[id] side = " << smalll.Side() << "\n";
            smalll.Element()->Print(*fOut);
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
			continue;
		}
		TPZCompEl *cel = large.Element();
		int ncl = cel->NConnects();
		int icl;
		for(icl=0; icl<ncl; icl++) {
			if(cel->ConnectIndex(icl) == connect) break;
		}
		if(icl == ncl) {
			check = 0;
			(*fOut) << "VerifyConnect of " << connect << " inconsistent\n";
		}
	}
	return check;
}